

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptrlist.c
# Opt level: O0

void * raviX_ptrlist_nth_entry(PtrList *list,uint idx)

{
  uint nr;
  PtrList *head;
  PtrList *pPStack_18;
  uint idx_local;
  PtrList *list_local;
  
  head._4_4_ = idx;
  pPStack_18 = list;
  if (list != (PtrList *)0x0) {
    do {
      if (head._4_4_ < (uint)(int)(short)(char)*(undefined2 *)pPStack_18) {
        return pPStack_18->list_[head._4_4_];
      }
      head._4_4_ = head._4_4_ - (int)(short)(char)*(undefined2 *)pPStack_18;
      pPStack_18 = pPStack_18->next_;
    } while (pPStack_18 != list);
  }
  return (void *)0x0;
}

Assistant:

void *raviX_ptrlist_nth_entry(PtrList *list, unsigned int idx)
{
	PtrList *head = list;
	if (!head)
		return NULL;
	do {
		unsigned int nr = list->nr_;
		if (idx < nr)
			return list->list_[idx];
		else
			idx -= nr;
	} while ((list = list->next_) != head);
	return NULL;
}